

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O2

void __thiscall CVmObjFrameRef::CVmObjFrameRef(CVmObjFrameRef *this,vm_val_t *fp,uchar *entry)

{
  ushort uVar1;
  int nparams;
  anon_union_8_8_cb74652f_for_val aVar2;
  undefined4 uVar3;
  vm_obj_id_t vVar4;
  vm_obj_id_t vVar5;
  vm_frameref_ext *pvVar6;
  long lVar7;
  uint uVar8;
  CVmFuncPtr f;
  CVmFuncPtr local_38;
  
  (this->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_0031c0e0;
  uVar1 = *(ushort *)(entry + 2);
  nparams = fp[-2].val.intval;
  (this->super_CVmObject).ext_ = (char *)0x0;
  local_38.p_ = entry;
  pvVar6 = alloc_ext(this,(uint)uVar1,nparams);
  pvVar6->fp = fp;
  pvVar6->entryp = entry;
  CVmFuncPtr::get_fnptr(&local_38,&pvVar6->entry);
  uVar8 = nparams + (uint)uVar1;
  lVar7 = 0;
  if ((int)uVar8 < 1) {
    uVar8 = 0;
  }
  for (; (ulong)uVar8 * 0x10 != lVar7; lVar7 = lVar7 + 0x10) {
    *(undefined4 *)((long)&pvVar6->vars[0].typ + lVar7) = 1;
  }
  uVar3 = *(undefined4 *)&fp[-8].field_0x4;
  aVar2 = fp[-8].val;
  (pvVar6->self).typ = fp[-8].typ;
  *(undefined4 *)&(pvVar6->self).field_0x4 = uVar3;
  (pvVar6->self).val = aVar2;
  vVar4 = 0;
  vVar5 = 0;
  if (fp[-9].typ == VM_OBJ) {
    vVar5 = fp[-9].val.obj;
  }
  pvVar6->defobj = vVar5;
  if (fp[-10].typ != VM_NIL) {
    vVar4 = fp[-10].val.obj;
  }
  pvVar6->targobj = vVar4;
  vVar5 = 0;
  if (fp[-9].typ == VM_OBJ) {
    vVar5 = fp[-9].val.obj;
  }
  pvVar6->defobj = vVar5;
  return;
}

Assistant:

CVmObjFrameRef::CVmObjFrameRef(VMG_ vm_val_t *fp,
                               const uchar *entry)
{
    /* set up a function pointer */
    CVmFuncPtr f(entry);

    /* 
     *   figure the total number of variable snapshot slots we need to
     *   allocate: this is the number of local variables plus the number of
     *   actual arguments 
     */
    int nlocals = f.get_local_cnt();
    int nparams = G_interpreter->get_argc_from_frame(vmg_ fp);

    /* allocate our extension */
    ext_ = 0;
    vm_frameref_ext *ext = alloc_ext(vmg_ nlocals, nparams);

    /* save the extra frame information */
    ext->fp = fp;
    ext->entryp = entry;

    /* get the function pointer value for the entry pointer */
    f.get_fnptr(vmg_ &ext->entry);

    /* initialize the variable slots to nil */
    for (int i = 0 ; i < nlocals + nparams ; ++i)
        ext->vars[i].set_nil();

    /* 
     *   save the method context variables - these are immutable, so we can
     *   save them immediately 
     */
    ext->self = *G_interpreter->get_self_val_from_frame(vmg_ fp);
    ext->defobj = G_interpreter->get_defining_obj_from_frame(vmg_ fp);
    ext->targobj = G_interpreter->get_orig_target_obj_from_frame(vmg_ fp);
    ext->defobj = G_interpreter->get_defining_obj_from_frame(vmg_ fp);
}